

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

void Of_ManComputeBackward1(Of_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *pCutSet;
  bool bVar4;
  int FaninId;
  int Required;
  int Cost;
  int CostMin;
  int *pCutMin;
  int *pCut;
  int *pList;
  int iVar;
  int k;
  int i;
  int DelayLut1;
  Gia_Obj_t *pObj;
  Of_Man_t *p_local;
  
  iVar1 = p->pPars->nDelayLut1;
  Of_ManComputeOutputRequired(p,1);
  p->pPars->Edge = 0;
  p->pPars->Area = 0;
  iVar = p->pGia->nObjs;
  while( true ) {
    do {
      while( true ) {
        do {
          iVar = iVar + -1;
          bVar4 = false;
          if (0 < iVar) {
            _i = Gia_ManObj(p->pGia,iVar);
            bVar4 = _i != (Gia_Obj_t *)0x0;
          }
          if (!bVar4) {
            return;
          }
          iVar2 = Gia_ObjIsAnd(_i);
        } while (iVar2 == 0);
        iVar2 = Of_ObjRequired(p,iVar);
        iVar3 = Gia_ObjIsBuf(_i);
        if (iVar3 == 0) break;
        iVar3 = Gia_ObjFaninId0(_i,iVar);
        Of_ObjUpdateRequired(p,iVar3,iVar2);
        Of_ObjRefInc(p,iVar3);
      }
      iVar3 = Of_ObjRefNum(p,iVar);
    } while (iVar3 == 0);
    _Cost = (int *)0x0;
    Required = 1000000000;
    pCutSet = Of_ObjCutSet(p,iVar);
    pList._4_4_ = 0;
    pCutMin = pCutSet + 1;
    while (pList._4_4_ < *pCutSet) {
      iVar3 = Of_CutDelay1(pCutMin);
      if ((iVar3 <= iVar2) && (iVar3 = Of_ManComputeBackwardCut(p,pCutMin), iVar3 < Required)) {
        _Cost = pCutMin;
        Required = iVar3;
      }
      pList._4_4_ = pList._4_4_ + 1;
      iVar3 = Of_CutSize(pCutMin);
      pCutMin = pCutMin + (iVar3 + 4);
    }
    if (_Cost == (int *)0x0) break;
    Of_ObjSetCutBestP(p,pCutSet,iVar,_Cost);
    pList._4_4_ = 0;
    while( true ) {
      iVar3 = Of_CutSize(_Cost);
      bVar4 = false;
      if (pList._4_4_ < iVar3) {
        pList._0_4_ = Of_CutVar(_Cost,pList._4_4_);
        bVar4 = (int)pList != 0;
      }
      if (!bVar4) break;
      Of_ObjUpdateRequired(p,(int)pList,iVar2 - iVar1);
      Of_ObjRefInc(p,(int)pList);
      pList._4_4_ = pList._4_4_ + 1;
    }
    iVar2 = Of_CutSize(_Cost);
    p->pPars->Edge = (long)iVar2 + p->pPars->Edge;
    p->pPars->Area = p->pPars->Area + 1;
  }
  __assert_fail("pCutMin != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaOf.c"
                ,0x4b2,"void Of_ManComputeBackward1(Of_Man_t *)");
}

Assistant:

void Of_ManComputeBackward1( Of_Man_t * p )
{
    Gia_Obj_t * pObj; 
    int DelayLut1 = p->pPars->nDelayLut1;
    int i, k, iVar, * pList, * pCut, * pCutMin;
    Of_ManComputeOutputRequired( p, 1 );
    // compute area and edges
    p->pPars->Area = p->pPars->Edge = 0;
    Gia_ManForEachAndReverse( p->pGia, pObj, i )
    {
        int CostMin, Cost, Required = Of_ObjRequired(p, i);
        if ( Gia_ObjIsBuf(pObj) )
        {
            int FaninId = Gia_ObjFaninId0(pObj, i);
            Of_ObjUpdateRequired( p, FaninId, Required );
            Of_ObjRefInc( p, FaninId );
            continue;
        }
        if ( !Of_ObjRefNum(p, i) )
            continue;
        // select the best cut
        pCutMin = NULL;
        CostMin = ABC_INFINITY;
        pList = Of_ObjCutSet( p, i );
        Of_SetForEachCut( pList, pCut, k )
        {
            if ( Of_CutDelay1(pCut) > Required )
                continue;
            Cost = Of_ManComputeBackwardCut( p, pCut );
            if ( CostMin > Cost )
            {
                CostMin = Cost;
                pCutMin = pCut;
            }
        }
        // the cut is selected
        assert( pCutMin != NULL );
        Of_ObjSetCutBestP( p, pList, i, pCutMin );
        Of_CutForEachVar( pCutMin, iVar, k )
        {
            Of_ObjUpdateRequired( p, iVar, Required - DelayLut1 );
            Of_ObjRefInc( p, iVar );
        }
        // update parameters
        p->pPars->Edge += Of_CutSize(pCutMin);
        p->pPars->Area++;
    }
}